

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O1

void __thiscall Liby::EventLoopGroup::~EventLoopGroup(EventLoopGroup *this)

{
  pointer ptVar1;
  pointer ppEVar2;
  pointer pcVar3;
  _Manager_type p_Var4;
  thread *th;
  pointer ptVar5;
  
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar5 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar5 != ptVar1; ptVar5 = ptVar5 + 1) {
    if ((ptVar5->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  ppEVar2 = (this->ploops_).
            super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2);
  }
  std::vector<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
  ::~vector(&this->loops_);
  pcVar3 = (this->chooser_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->chooser_).field_2) {
    operator_delete(pcVar3);
  }
  p_Var4 = (this->bf_).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->bf_,(_Any_data *)&this->bf_,__destroy_functor);
  }
  return;
}

Assistant:

EventLoopGroup::~EventLoopGroup() {
    for (auto &th : threads_) {
        if (th.joinable()) {
            th.join();
        }
    }
}